

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O0

int lws_h2_client_stream_long_poll_rxonly(lws *wsi)

{
  bool bVar1;
  lws *wsi_local;
  
  bVar1 = (*(ulong *)&wsi->field_0x2dc >> 1 & 1) != 0;
  if (bVar1) {
    (wsi->h2).field_0x11 = (wsi->h2).field_0x11 & 0xf7 | 8;
    (wsi->h2).field_0x11 = (wsi->h2).field_0x11 & 0xfb | 4;
    lws_callback_on_writable(wsi);
  }
  wsi_local._4_4_ = (uint)!bVar1;
  return wsi_local._4_4_;
}

Assistant:

int
lws_h2_client_stream_long_poll_rxonly(struct lws *wsi)
{

	if (!wsi->mux_substream)
		return 1;

	/*
	 * Elect to send an empty DATA with END_STREAM, to force the stream
	 * into HALF_CLOSED LOCAL
	 */
	wsi->h2.long_poll = 1;
	wsi->h2.send_END_STREAM = 1;

	// lws_header_table_detach(wsi, 0);

	lws_callback_on_writable(wsi);

	return 0;
}